

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void emitfs(internal_state *state,int fs)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = state->bits;
  while( true ) {
    uVar3 = fs - iVar2;
    if (fs < iVar2) break;
    puVar1 = state->cds;
    state->cds = puVar1 + 1;
    puVar1[1] = '\0';
    state->bits = 8;
    iVar2 = 8;
    fs = uVar3;
  }
  state->bits = iVar2 + ~fs;
  *state->cds = *state->cds + (char)(1 << ((byte)(iVar2 + ~fs) & 0x1f));
  return;
}

Assistant:

static inline void emitfs(struct internal_state *state, int fs)
{
    /**
       Emits a fundamental sequence.

       fs zero bits followed by one 1 bit.
     */

    for(;;) {
        if (fs < state->bits) {
            state->bits -= fs + 1;
            *state->cds += 1U << state->bits;
            break;
        } else {
            fs -= state->bits;
            *++state->cds = 0;
            state->bits = 8;
        }
    }
}